

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> __thiscall
unodb::detail::impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (impl_helpers *this,
          inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,node_ptr *node_in_parent)

{
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
  *this_00;
  _Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ptr_;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var1;
  uintptr_t uVar2;
  undefined7 in_register_00000011;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var3;
  ulong uVar4;
  art_key_type k_00;
  find_result fVar5;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar6;
  basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
  local_60 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  undefined7 extraout_var;
  
  k_00.field_0._1_7_ = in_register_00000011;
  k_00.field_0.key_bytes._M_elems[0] = key_byte;
  fVar5 = basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::find_child((basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        *)this,(byte)inode);
  _Var3 = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)fVar5.second;
  new_node._M_t.
  super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ._M_head_impl._0_1_ = fVar5.first;
  _Var1 = fVar5._0_8_;
  if (_Var3._M_value != (basic_node_ptr<unodb::detail::node_header> *)0x0) {
    this_00 = (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
               *)((basic_node_ptr<unodb::detail::node_header> *)&(_Var3._M_value)->tagged_ptr)->
                 tagged_ptr;
    uVar4 = CONCAT71(k.field_0._9_7_,1);
    if (((ulong)this_00 & 7) != 0) goto LAB_00143a80;
    k_00.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)
         (__extent_storage<18446744073709551615UL>)k.field_0._0_8_;
    _Var1._0_1_ = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>
                  ::matches(this_00,k_00);
    _Var1._1_7_ = extraout_var;
    if (_Var1._0_1_) {
      if (this[8] == (impl_helpers)0x5) {
        basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
        ::
        make_db_inode_unique_ptr<unodb::detail::inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unsigned_char_const&>
                  (local_60,k.field_0._8_8_,
                   (inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    *)this,(uchar *)&new_node._M_t.
                                     super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                     .
                                     super__Head_base<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                  );
        ptr_ = new_node._M_t.
               super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               .
               super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ;
        new_node._M_t.
        super___uniq_ptr_impl<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        ._M_head_impl.db =
             (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
              )(basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                )0x0;
        uVar2 = basic_node_ptr<unodb::detail::node_header>::tag_ptr
                          ((node_header *)
                           ptr_.
                           super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                           ._M_head_impl.db,I4);
        (db_instance->root).tagged_ptr = uVar2;
        std::
        unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)local_60);
        db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
        ::account_shrinking_inode<(unodb::node_type)2>(k.field_0._8_8_);
      }
      else {
        basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::remove((basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  *)this,(char *)(ulong)(fVar5._0_4_ & 0xff));
      }
      _Var3._M_value = (basic_node_ptr<unodb::detail::node_header> *)0x0;
      goto LAB_00143a80;
    }
  }
  _Var3 = _Var1;
  uVar4 = 0;
LAB_00143a80:
  oVar6.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._8_8_ =
       uVar4 & 0xffffffff;
  oVar6.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload._M_value = _Var3._M_value;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar6.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}